

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSplineLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::SplineLoader::begin__input____InputLocal
          (SplineLoader *this,input____InputLocal__AttributeData *attributeData)

{
  void *pvVar1;
  long in_RSI;
  InputUnshared *in_RDI;
  String *source;
  String *semantic;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 uVar2;
  _Alloc_hider in_stack_ffffffffffffff97;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_31;
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  pvVar1 = operator_new(0xf8);
  uVar2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff97,CONCAT16(uVar2,in_stack_ffffffffffffff90)));
  source = *(String **)(local_10 + 8);
  semantic = (String *)&stack0xffffffffffffff97;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (allocator<char> *)
             CONCAT17(in_stack_ffffffffffffff97,CONCAT16(uVar2,in_stack_ffffffffffffff90)));
  InputUnshared::InputUnshared(in_RDI,semantic,source);
  *(void **)&in_RDI[1].mSource.mOriginalURIString = pvVar1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return true;
}

Assistant:

bool SplineLoader::begin__input____InputLocal( const input____InputLocal__AttributeData& attributeData )
	{
		mCurrentVertexInput = new InputUnshared(attributeData.semantic, attributeData.source);
		return true;
	}